

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O0

int __thiscall TPZFMatrix<long_double>::Zero(TPZFMatrix<long_double> *this)

{
  long in_RDI;
  int64_t size;
  
  memset(*(void **)(in_RDI + 0x20),0,*(long *)(in_RDI + 8) * *(long *)(in_RDI + 0x10) * 0x10);
  *(undefined1 *)(in_RDI + 0x18) = 0;
  return 1;
}

Assistant:

inline int TPZFMatrix<TVar>::Zero() {
    int64_t size = this->fRow * this->fCol * sizeof(TVar);
    memset(((void*)this->fElem),'\0',size);
    this->fDecomposed = 0;
    return( 1 );
}